

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecache.c
# Opt level: O2

void h2o_filecache_clear(h2o_filecache_t *cache)

{
  kh_opencache_set_t *pkVar1;
  uint iter;
  byte bVar2;
  
  bVar2 = 0;
  for (iter = 0; pkVar1 = cache->hash, iter != pkVar1->n_buckets; iter = iter + 1) {
    if ((pkVar1->flags[iter >> 4] >> (bVar2 & 0x1e) & 3) == 0) {
      release_from_cache(cache,iter);
    }
    bVar2 = bVar2 + 2;
  }
  if (pkVar1->size == 0) {
    return;
  }
  __assert_fail("kh_size(cache->hash) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/urbit[P]h2o/lib/common/filecache.c"
                ,0x50,"void h2o_filecache_clear(h2o_filecache_t *)");
}

Assistant:

void h2o_filecache_clear(h2o_filecache_t *cache)
{
    khiter_t iter;
    for (iter = kh_begin(cache->hash); iter != kh_end(cache->hash); ++iter) {
        if (!kh_exist(cache->hash, iter))
            continue;
        release_from_cache(cache, iter);
    }
    assert(kh_size(cache->hash) == 0);
}